

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# minilua.c
# Opt level: O0

void singlevar(LexState *ls,expdesc *var)

{
  int iVar1;
  TString *s;
  FuncState *in_RSI;
  long in_RDI;
  FuncState *fs;
  TString *varname;
  expdesc *in_stack_ffffffffffffffd8;
  LexState *in_stack_ffffffffffffffe0;
  
  s = str_checkname(in_stack_ffffffffffffffe0);
  iVar1 = singlevaraux((FuncState *)&s->tsv,*(TString **)(in_RDI + 0x30),in_stack_ffffffffffffffd8,0
                      );
  if (iVar1 == 8) {
    iVar1 = luaK_stringK(in_RSI,s);
    *(int *)&in_RSI->h = iVar1;
  }
  return;
}

Assistant:

static void singlevar(LexState*ls,expdesc*var){
TString*varname=str_checkname(ls);
FuncState*fs=ls->fs;
if(singlevaraux(fs,varname,var,1)==VGLOBAL)
var->u.s.info=luaK_stringK(fs,varname);
}